

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uECC.c
# Opt level: O3

uECC_word_t
EccPoint_compute_public_key(uECC_word_t *result,uECC_word_t *private_key,uECC_Curve curve)

{
  byte bVar1;
  int iVar2;
  uECC_word_t uVar3;
  ulong uVar4;
  uECC_word_t *puVar5;
  uint uVar6;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  undefined1 auVar7 [16];
  uECC_word_t *p2 [2];
  uECC_word_t tmp2 [4];
  uECC_word_t tmp1 [4];
  uECC_word_t *local_78 [2];
  uECC_word_t local_68 [4];
  uECC_word_t local_48 [5];
  
  local_78[0] = local_48;
  local_78[1] = local_68;
  uVar3 = regularize_k(private_key,local_78[0],local_78[1],curve);
  if (g_rng_function == (uECC_RNG_Function)0x0) {
    puVar5 = (uECC_word_t *)0x0;
  }
  else {
    puVar5 = local_78[uVar3];
    iVar2 = uECC_generate_random_int(puVar5,curve->p,curve->num_words);
    if (iVar2 == 0) {
      return 0;
    }
  }
  EccPoint_mult(result,curve->G,local_78[uVar3 ^ 1],puVar5,curve->num_n_bits + 1,curve);
  bVar1 = curve->num_words * '\x02';
  if ((char)bVar1 < '\x01') {
    return 0;
  }
  uVar6 = 0;
  uVar8 = 0;
  uVar9 = 0;
  uVar10 = 0;
  uVar4 = 0;
  do {
    puVar5 = result + uVar4;
    uVar6 = uVar6 | (uint)*puVar5;
    uVar8 = uVar8 | *(uint *)((long)puVar5 + 4);
    uVar9 = uVar9 | (uint)puVar5[1];
    uVar10 = uVar10 | *(uint *)((long)puVar5 + 0xc);
    uVar4 = uVar4 + 2;
  } while (bVar1 != uVar4);
  auVar7._0_4_ = -(uint)(uVar6 == 0);
  auVar7._4_4_ = -(uint)(uVar8 == 0);
  auVar7._8_4_ = -(uint)(uVar9 == 0);
  auVar7._12_4_ = -(uint)(uVar10 == 0);
  iVar2 = movmskps((int)uVar4,auVar7);
  return (ulong)(iVar2 != 0xf);
}

Assistant:

static uECC_word_t EccPoint_compute_public_key(uECC_word_t *result,
                                               uECC_word_t *private_key,
                                               uECC_Curve curve) {
    uECC_word_t tmp1[uECC_MAX_WORDS];
    uECC_word_t tmp2[uECC_MAX_WORDS];
    uECC_word_t *p2[2] = {tmp1, tmp2};
    uECC_word_t *initial_Z = 0;
    uECC_word_t carry;

    /* Regularize the bitcount for the private key so that attackers cannot use a side channel
       attack to learn the number of leading zeros. */
    carry = regularize_k(private_key, tmp1, tmp2, curve);

    /* If an RNG function was specified, try to get a random initial Z value to improve
       protection against side-channel attacks. */
    if (g_rng_function) {
        if (!uECC_generate_random_int(p2[carry], curve->p, curve->num_words)) {
            return 0;
        }
        initial_Z = p2[carry];
    }
    EccPoint_mult(result, curve->G, p2[!carry], initial_Z, curve->num_n_bits + 1, curve);

    if (EccPoint_isZero(result, curve)) {
        return 0;
    }
    return 1;
}